

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O1

void __thiscall
ParticleArrayTest_Size_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>_>::
~ParticleArrayTest_Size_Test
          (ParticleArrayTest_Size_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Size)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles;
    int numParticles = 12;
    for (int i = 0; i < numParticles; i++)
        particles.pushBack(this->randomParticle());
    ASSERT_EQ(numParticles, particles.size());
}